

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  uint uVar2;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar3;
  stbi__context *psVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  stbi_uc *psVar16;
  stbi_uc *psVar17;
  stbi_uc *psVar18;
  stbi_uc *psVar19;
  size_t sVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  stbi__uint32 raw_len_00;
  uint uVar24;
  byte bVar25;
  int out_n;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong local_4d8;
  stbi_uc tc [3];
  uint local_4c0;
  size_t local_4a8;
  ulong local_490;
  stbi__uint32 raw_len;
  stbi_uc *local_448;
  long local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  psVar18 = s->buffer_start;
  psVar19 = s->buffer_start + 1;
  bVar9 = 0;
  bVar5 = true;
  uVar24 = 0;
  uVar14 = 0;
  bVar6 = false;
  local_4c0 = 0;
  local_4a8 = 0;
  local_4d8 = 0;
  bVar7 = false;
  bVar25 = 0;
  do {
    iVar10 = stbi__get16be(s);
    uVar11 = stbi__get16be(s);
    uVar2 = iVar10 * 0x10000 + uVar11;
    uVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    uVar13 = uVar13 | uVar12 << 0x10;
    uVar23 = (uint)local_4d8;
    if ((int)uVar13 < 0x49484452) {
      if (uVar13 == 0x43674249) {
        bVar6 = true;
      }
      else {
        if (uVar13 == 0x49444154) {
          if ((!bVar5) && ((bVar25 == 0 || (local_4c0 != 0)))) {
            if (scan == 2) {
              s->img_n = (uint)bVar25;
              return 1;
            }
            uVar11 = uVar2 + uVar23;
            if ((int)uVar11 < (int)uVar23) {
              return 0;
            }
            if ((uint)local_4a8 < uVar11) {
              sVar20 = 0x1000;
              if (0x1000 < uVar2) {
                sVar20 = (ulong)uVar2;
              }
              if ((uint)local_4a8 != 0) {
                sVar20 = local_4a8;
              }
              do {
                local_4a8 = sVar20;
                sVar20 = (ulong)((uint)local_4a8 * 2);
              } while ((uint)local_4a8 < uVar11);
              psVar16 = (stbi_uc *)realloc(*ppsVar1,local_4a8);
              if (psVar16 == (stbi_uc *)0x0) {
                stbi__g_failure_reason = "Out of memory";
                return 0;
              }
              *ppsVar1 = psVar16;
            }
            else {
              psVar16 = *ppsVar1;
            }
            iVar10 = stbi__getn(s,psVar16 + local_4d8,uVar2);
            bVar5 = false;
            uVar23 = uVar11;
            if (iVar10 != 0) goto LAB_0010f6ef;
          }
          goto LAB_0010f9eb;
        }
        if (uVar13 == 0x49454e44) {
          if (!bVar5) {
            if (scan != 0) {
              return 1;
            }
            if (*ppsVar1 != (stbi_uc *)0x0) {
              raw_len = s->img_n * s->img_y * (s->img_x * uVar14 + 7 >> 3) + s->img_y;
              psVar18 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar1,uVar23,raw_len,(int *)&raw_len,(uint)!bVar6);
              z->expanded = psVar18;
              if (psVar18 == (stbi_uc *)0x0) {
                return 0;
              }
              free(z->idata);
              raw_len_00 = raw_len;
              z->idata = (stbi_uc *)0x0;
              iVar10 = s->img_n + 1;
              iVar15 = s->img_n;
              if (bVar7) {
                iVar15 = iVar10;
              }
              out_n = iVar15;
              if (req_comp != 3) {
                out_n = iVar10;
              }
              if (bVar25 != 0) {
                out_n = iVar15;
              }
              if (iVar10 != req_comp) {
                out_n = iVar15;
              }
              s->img_out_n = out_n;
              psVar18 = z->expanded;
              x = z->s->img_x;
              y = z->s->img_y;
              if (bVar9 == 0) {
                iVar10 = stbi__create_png_image_raw(z,psVar18,raw_len,out_n,x,y,uVar14,uVar24);
                if (iVar10 == 0) {
                  return 0;
                }
              }
              else {
                psVar19 = (stbi_uc *)malloc((ulong)(x * out_n * y));
                sVar20 = (size_t)out_n;
                lVar29 = 0;
                do {
                  psVar4 = z->s;
                  uVar2 = (&DAT_00118510)[lVar29];
                  uVar23 = (&DAT_00118550)[lVar29];
                  uVar26 = ~uVar2 + psVar4->img_x + uVar23;
                  uVar12 = uVar26 / uVar23;
                  local_4c0 = (&DAT_00118530)[lVar29];
                  uVar11 = (&DAT_00118570)[lVar29];
                  uVar21 = ~local_4c0 + psVar4->img_y + uVar11;
                  uVar13 = uVar21 / uVar11;
                  if ((uVar23 <= uVar26) && (uVar11 <= uVar21)) {
                    iVar10 = psVar4->img_n;
                    local_440 = lVar29;
                    iVar15 = stbi__create_png_image_raw
                                       (z,psVar18,raw_len_00,out_n,uVar12,uVar13,uVar14,uVar24);
                    if (iVar15 == 0) {
                      free(psVar19);
                      return 0;
                    }
                    local_448 = psVar18;
                    if (0 < (int)uVar13) {
                      local_4c0 = local_4c0 * out_n;
                      local_490 = 0;
                      do {
                        if (0 < (int)uVar12) {
                          psVar18 = z->out;
                          psVar16 = psVar19 + (ulong)(z->s->img_x * local_4c0) +
                                              (long)(int)uVar2 * sVar20;
                          lVar29 = 0;
                          do {
                            memcpy(psVar16,psVar18 + (lVar29 + local_490 * (long)(int)uVar12) *
                                                     sVar20,sVar20);
                            lVar29 = lVar29 + 1;
                            psVar16 = psVar16 + (long)(int)uVar23 * sVar20;
                          } while (lVar29 < (int)uVar12);
                        }
                        local_490 = local_490 + 1;
                        local_4c0 = local_4c0 + uVar11 * out_n;
                      } while (local_490 < uVar13);
                    }
                    uVar13 = (((int)(uVar12 * uVar14 * iVar10 + 7) >> 3) + 1) * uVar13;
                    free(z->out);
                    psVar18 = local_448 + uVar13;
                    raw_len_00 = raw_len_00 - uVar13;
                    lVar29 = local_440;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 7);
                z->out = psVar19;
              }
              if (bVar7) {
                psVar18 = z->out;
                iVar10 = z->s->img_y * z->s->img_x;
                if (s->img_out_n == 2) {
                  if (iVar10 != 0) {
                    lVar29 = 0;
                    do {
                      psVar18[lVar29 * 2 + 1] = -(psVar18[lVar29 * 2] != tc[0]);
                      lVar29 = lVar29 + 1;
                    } while (iVar10 != (int)lVar29);
                  }
                }
                else {
                  if (s->img_out_n != 4) {
                    __assert_fail("out_n == 2 || out_n == 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                                  ,0x105a,
                                  "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
                  }
                  if (iVar10 != 0) {
                    lVar29 = 0;
                    do {
                      if (((psVar18[lVar29 * 4] == tc[0]) && (psVar18[lVar29 * 4 + 1] == tc[1])) &&
                         (psVar18[lVar29 * 4 + 2] == tc[2])) {
                        psVar18[lVar29 * 4 + 3] = '\0';
                      }
                      lVar29 = lVar29 + 1;
                    } while (iVar10 != (int)lVar29);
                  }
                }
              }
              if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                stbi__de_iphone((stbi__png *)z->s);
              }
              if (bVar25 != 0) {
                s->img_n = (uint)bVar25;
                uVar14 = (uint)bVar25;
                if (2 < req_comp) {
                  uVar14 = req_comp;
                }
                s->img_out_n = uVar14;
                psVar18 = z->out;
                uVar24 = z->s->img_y * z->s->img_x;
                psVar19 = (stbi_uc *)malloc((ulong)(uVar24 * uVar14));
                if (psVar19 == (stbi_uc *)0x0) {
                  stbi__g_failure_reason = "Out of memory";
                  return 0;
                }
                if (uVar14 == 3) {
                  if (uVar24 != 0) {
                    uVar28 = 0;
                    psVar16 = psVar19;
                    do {
                      uVar27 = (ulong)psVar18[uVar28];
                      *psVar16 = palette[uVar27 * 4];
                      psVar16[1] = palette[uVar27 * 4 + 1];
                      psVar16[2] = palette[uVar27 * 4 + 2];
                      psVar16 = psVar16 + 3;
                      uVar28 = uVar28 + 1;
                    } while (uVar24 != uVar28);
                  }
                }
                else if (uVar24 != 0) {
                  uVar28 = 0;
                  do {
                    *(undefined4 *)(psVar19 + uVar28 * 4) =
                         *(undefined4 *)(palette + (ulong)psVar18[uVar28] * 4);
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                free(psVar18);
                z->out = psVar19;
              }
              free(z->expanded);
              z->expanded = (stbi_uc *)0x0;
              return 1;
            }
          }
LAB_0010f9eb:
          stbi__g_failure_reason = "Corrupt PNG";
          return 0;
        }
LAB_0010f6c2:
        if (bVar5) goto LAB_0010f9eb;
        bVar5 = false;
        if ((uVar12 >> 0xd & 1) == 0) {
          stbi__g_failure_reason = "PNG not supported: unknown PNG chunk type";
          return 0;
        }
      }
      stbi__skip(s,uVar2);
    }
    else if (uVar13 == 0x74524e53) {
      if ((bVar5) || (*ppsVar1 != (stbi_uc *)0x0)) goto LAB_0010f9eb;
      if (bVar25 == 0) {
        uVar11 = s->img_n;
        if (((uVar11 & 1) == 0) || (uVar11 * 2 != uVar2)) goto LAB_0010f9eb;
        bVar7 = true;
        if (0 < (int)uVar11) {
          lVar29 = 0;
          do {
            iVar10 = stbi__get16be(s);
            tc[lVar29] = ""[uVar14] * (char)iVar10;
            lVar29 = lVar29 + 1;
          } while (lVar29 < s->img_n);
        }
        bVar5 = false;
        bVar25 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if ((local_4c0 == 0) || (local_4c0 < uVar2)) goto LAB_0010f9eb;
        bVar25 = 4;
        bVar5 = false;
        if (uVar2 != 0) {
          psVar16 = s->img_buffer;
          psVar17 = s->img_buffer_end;
          uVar28 = 0;
          do {
            if (psVar16 < psVar17) {
              s->img_buffer = psVar16 + 1;
              bVar22 = *psVar16;
              psVar16 = psVar16 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar22 = 0;
            }
            else {
              iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
              if (iVar15 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar22 = 0;
                psVar17 = psVar19;
              }
              else {
                bVar22 = *psVar18;
                psVar17 = psVar18 + iVar15;
              }
              s->img_buffer_end = psVar17;
              s->img_buffer = psVar19;
              psVar16 = psVar19;
            }
            palette[uVar28 * 4 + 3] = bVar22;
            uVar28 = uVar28 + 1;
          } while (uVar11 + iVar10 * 0x10000 != uVar28);
        }
      }
    }
    else if (uVar13 == 0x504c5445) {
      if (((bVar5) || (0x300 < uVar2)) ||
         (local_4c0 = uVar11 * 0xaaab >> 0x11, local_4c0 * 3 != uVar2)) goto LAB_0010f9eb;
      bVar5 = false;
      if (2 < uVar11) {
        psVar16 = s->img_buffer;
        psVar17 = s->img_buffer_end;
        uVar28 = 0;
        do {
          if (psVar16 < psVar17) {
            s->img_buffer = psVar16 + 1;
            bVar22 = *psVar16;
            psVar16 = psVar16 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar17 = psVar19;
            }
            else {
              bVar22 = *psVar18;
              psVar17 = psVar18 + iVar10;
            }
            s->img_buffer_end = psVar17;
            s->img_buffer = psVar19;
            psVar16 = psVar19;
          }
          palette[uVar28 * 4] = bVar22;
          if (psVar16 < psVar17) {
            s->img_buffer = psVar16 + 1;
            bVar22 = *psVar16;
            psVar16 = psVar16 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar17 = psVar19;
            }
            else {
              bVar22 = *psVar18;
              psVar17 = psVar18 + iVar10;
            }
            s->img_buffer_end = psVar17;
            s->img_buffer = psVar19;
            psVar16 = psVar19;
          }
          palette[uVar28 * 4 + 1] = bVar22;
          if (psVar16 < psVar17) {
            s->img_buffer = psVar16 + 1;
            bVar22 = *psVar16;
            psVar16 = psVar16 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar17 = psVar19;
            }
            else {
              bVar22 = *psVar18;
              psVar17 = psVar18 + iVar10;
            }
            s->img_buffer_end = psVar17;
            s->img_buffer = psVar19;
            psVar16 = psVar19;
          }
          palette[uVar28 * 4 + 2] = bVar22;
          palette[uVar28 * 4 + 3] = 0xff;
          uVar28 = uVar28 + 1;
        } while (local_4c0 != uVar28);
      }
    }
    else {
      if (uVar13 != 0x49484452) goto LAB_0010f6c2;
      if ((!bVar5) || (uVar2 != 0xd)) goto LAB_0010f9eb;
      iVar10 = stbi__get16be(s);
      uVar14 = stbi__get16be(s);
      uVar14 = uVar14 | iVar10 << 0x10;
      s->img_x = uVar14;
      if (0x1000000 < uVar14) {
LAB_0010f9d9:
        stbi__g_failure_reason = "Very large image (corrupt?)";
        return 0;
      }
      iVar10 = stbi__get16be(s);
      uVar14 = stbi__get16be(s);
      uVar14 = uVar14 | iVar10 << 0x10;
      s->img_y = uVar14;
      if (0x1000000 < uVar14) goto LAB_0010f9d9;
      pbVar3 = s->img_buffer;
      psVar16 = s->img_buffer_end;
      if (pbVar3 < psVar16) {
        s->img_buffer = pbVar3 + 1;
        bVar9 = *pbVar3;
        psVar17 = pbVar3 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010fa25;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar9 = 0;
          psVar16 = psVar19;
        }
        else {
          bVar9 = *psVar18;
          psVar16 = psVar18 + iVar10;
        }
        s->img_buffer_end = psVar16;
        s->img_buffer = psVar19;
        psVar17 = psVar19;
      }
      if ((8 < bVar9) || (uVar14 = (uint)bVar9, (0x116U >> (bVar9 & 0x1f) & 1) == 0)) {
LAB_0010fa25:
        stbi__g_failure_reason = "PNG not supported: 1/2/4/8-bit only";
        return 0;
      }
      if (psVar17 < psVar16) {
        s->img_buffer = psVar17 + 1;
        uVar24 = (uint)*psVar17;
        psVar17 = psVar17 + 1;
LAB_0010f881:
        bVar22 = (byte)uVar24;
        if (6 < bVar22) goto LAB_0010f9eb;
        if (bVar22 == 3) {
          uVar24 = 3;
          bVar22 = 3;
          bVar25 = 3;
        }
        else if ((uVar24 & 1) != 0) goto LAB_0010f9eb;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            uVar24 = 0;
            psVar16 = psVar19;
          }
          else {
            uVar24 = (uint)*psVar18;
            psVar16 = psVar18 + iVar10;
          }
          s->img_buffer_end = psVar16;
          s->img_buffer = psVar19;
          psVar17 = psVar19;
          goto LAB_0010f881;
        }
        bVar22 = 0;
        uVar24 = 0;
      }
      if (psVar17 < psVar16) {
        s->img_buffer = psVar17 + 1;
        bVar9 = *psVar17;
LAB_0010f903:
        if (bVar9 != 0) goto LAB_0010f9eb;
      }
      else if (s->read_from_callbacks != 0) {
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar9 = 0;
          psVar16 = psVar19;
        }
        else {
          bVar9 = *psVar18;
          psVar16 = psVar18 + iVar10;
        }
        s->img_buffer_end = psVar16;
        s->img_buffer = psVar19;
        goto LAB_0010f903;
      }
      sVar8 = stbi__get8(s);
      if ((((sVar8 != '\0') || (bVar9 = stbi__get8(s), 1 < bVar9)) || (uVar2 = s->img_x, uVar2 == 0)
          ) || (uVar11 = s->img_y, uVar11 == 0)) goto LAB_0010f9eb;
      if (bVar25 == 0) {
        uVar12 = (uint)(3 < bVar22) + (uVar24 & 2) + 1;
        s->img_n = uVar12;
        if ((uint)((0x40000000 / (ulong)uVar2) / (ulong)uVar12) < uVar11) {
          stbi__g_failure_reason = "Image too large to decode";
          return 0;
        }
        bVar5 = false;
        bVar25 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar5 = false;
        if ((uint)(0x40000000 / (ulong)uVar2 >> 2) < uVar11) goto LAB_0010f9eb;
      }
    }
LAB_0010f6ef:
    stbi__get16be(s);
    stbi__get16be(s);
    local_4d8 = (ulong)uVar23;
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}